

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

MemPage * btreePageLookup(BtShared *pBt,Pgno pgno)

{
  BtShared *pBt_00;
  Pgno in_ESI;
  DbPage *in_RDI;
  DbPage *pDbPage;
  undefined8 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  pBt_00 = (BtShared *)
           sqlite3PagerLookup((Pager *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                              (Pgno)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if (pBt_00 == (BtShared *)0x0) {
    local_8 = (MemPage *)0x0;
  }
  else {
    local_8 = btreePageFromDbPage(in_RDI,in_ESI,pBt_00);
  }
  return local_8;
}

Assistant:

static MemPage *btreePageLookup(BtShared *pBt, Pgno pgno){
  DbPage *pDbPage;
  assert( sqlite3_mutex_held(pBt->mutex) );
  pDbPage = sqlite3PagerLookup(pBt->pPager, pgno);
  if( pDbPage ){
    return btreePageFromDbPage(pDbPage, pgno, pBt);
  }
  return 0;
}